

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtest.c
# Opt level: O1

int noentParseTest(char *filename,char *result,char *err,int options)

{
  int iVar1;
  int iVar2;
  long lVar3;
  char *r1;
  undefined4 *puVar4;
  uint uVar5;
  char *filename_00;
  char *filename_01;
  char *pcVar6;
  bool bVar7;
  int iStack_74;
  char *pcStack_70;
  undefined8 uStack_68;
  char *pcStack_60;
  long lStack_58;
  char *pcStack_50;
  
  nb_tests = nb_tests + 1;
  uVar5 = options;
  lVar3 = xmlReadFile(filename,0,options);
  if (lVar3 == 0) {
    return 1;
  }
  filename_01 = temp_directory;
  pcVar6 = filename;
  r1 = resultFilename(filename,temp_directory,".res");
  if (r1 != (char *)0x0) {
    xmlSaveFile(r1,lVar3);
    iVar1 = compareFiles(r1,result);
    xmlFreeDoc(lVar3);
    lVar3 = xmlReadFile(filename,0,options);
    if (lVar3 == 0) {
      return 1;
    }
    xmlSaveFile(r1,lVar3);
    iVar2 = compareFiles(r1,result);
    xmlFreeDoc(lVar3);
    unlink(r1);
    free(r1);
    return (uint)(iVar2 != 0 || iVar1 != 0);
  }
  noentParseTest_cold_1();
  uStack_68 = 1;
  pcStack_70 = (char *)0x0;
  nb_tests = nb_tests + 1;
  pcStack_60 = filename;
  lStack_58 = lVar3;
  pcStack_50 = result;
  if ((uVar5 >> 0x18 & 1) == 0) {
    if ((uVar5 >> 10 & 1) == 0) {
      puVar4 = (undefined4 *)__xmlGetWarningsDefaultValue();
      *puVar4 = 1;
      lVar3 = xmlReadFile(pcVar6,0,uVar5);
    }
    else {
      lVar3 = xmlReadFile(pcVar6,0,uVar5);
      xmlXIncludeProcessFlags(lVar3,uVar5);
    }
  }
  else {
    lVar3 = htmlReadFile(pcVar6,0,uVar5);
  }
  puVar4 = (undefined4 *)__xmlGetWarningsDefaultValue();
  *puVar4 = 0;
  if (filename_01 == (char *)0x0) {
    bVar7 = true;
  }
  else {
    if (lVar3 == 0) {
      pcStack_70 = "";
      iStack_74 = 0;
    }
    else if ((uVar5 >> 0x18 & 1) == 0) {
      xmlDocDumpMemory();
    }
    else {
      htmlDocDumpMemory(lVar3,&pcStack_70,&iStack_74);
    }
    iVar1 = compareFileMem(filename_01,pcStack_70,iStack_74);
    bVar7 = iVar1 == 0;
  }
  if (lVar3 != 0) {
    if (pcStack_70 != (char *)0x0) {
      (*_xmlFree)();
    }
    xmlFreeDoc(lVar3);
  }
  if (bVar7) {
    if (filename_00 == (char *)0x0) {
      if ((uVar5 & 0x10) == 0) {
        return 0;
      }
      if (testErrorsSize == 0) {
        return 0;
      }
      fprintf(_stderr,"Validation for %s failed\n",pcVar6);
      return 0;
    }
    iVar1 = compareFileMem(filename_00,testErrors,testErrorsSize);
    if (iVar1 == 0) {
      return 0;
    }
    fprintf(_stderr,"Error for %s failed\n",pcVar6);
  }
  else {
    fprintf(_stderr,"Result for %s failed in %s\n",pcVar6,filename_01);
  }
  return -1;
}

Assistant:

static int
noentParseTest(const char *filename, const char *result,
               const char *err  ATTRIBUTE_UNUSED,
	       int options) {
    xmlDocPtr doc;
    char *temp;
    int res = 0;

    nb_tests++;
    /*
     * base of the test, parse with the old API
     */
    doc = xmlReadFile(filename, NULL, options);
    if (doc == NULL)
        return(1);
    temp = resultFilename(filename, temp_directory, ".res");
    if (temp == NULL) {
        fprintf(stderr, "Out of memory\n");
        fatalError();
    }
    xmlSaveFile(temp, doc);
    if (compareFiles(temp, result)) {
        res = 1;
    }
    xmlFreeDoc(doc);

    /*
     * Parse the saved result to make sure the round trip is okay
     */
    doc = xmlReadFile(filename, NULL, options);
    if (doc == NULL)
        return(1);
    xmlSaveFile(temp, doc);
    if (compareFiles(temp, result)) {
        res = 1;
    }
    xmlFreeDoc(doc);

    if (temp != NULL) {
        unlink(temp);
        free(temp);
    }
    return(res);
}